

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  mapped_type *pmVar1;
  size_t in_RCX;
  char *in_RDX;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  unordered_map<spdlog::level::level_enum,_fmt::v6::basic_string_view<char>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffc0,in_RDI);
  pmVar1 = std::
           unordered_map<spdlog::level::level_enum,_fmt::v6::basic_string_view<char>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>_>
           ::operator[](in_stack_ffffffffffffffc0,(key_type *)in_RDI);
  pmVar1->data_ = in_RDX;
  pmVar1->size_ = in_RCX;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24b66d);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[color_level] = color;
}